

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqapi.cpp
# Opt level: O2

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool invoke_err_handler,
                    SQBool throwerror)

{
  long lVar1;
  bool bVar2;
  ExecutionType et;
  SQObjectPtr *pSVar3;
  SQObjectPtr *this;
  SQRESULT SVar4;
  SQObjectPtr ret;
  SQObjectPtr dummy;
  
  ret.super_SQObject._unVal.pTable = (SQTable *)0x0;
  ret.super_SQObject._type = OT_NULL;
  ret.super_SQObject._flags = '\0';
  ret.super_SQObject._5_3_ = 0;
  if (v->_suspended == 0) {
    sq_throwerror(v,"cannot resume a vm that is not running any code");
    SVar4 = -1;
  }
  else {
    lVar1 = v->_suspended_target;
    if (wakeupret == 0) {
      if (lVar1 != -1) {
        pSVar3 = SQVM::GetAt(v,lVar1 + v->_stackbase);
        SQObjectPtr::Null(pSVar3);
      }
    }
    else {
      if (lVar1 != -1) {
        pSVar3 = SQVM::GetUp(v,-1);
        this = SQVM::GetAt(v,v->_suspended_target + v->_stackbase);
        SQObjectPtr::operator=(this,pSVar3);
      }
      SQVM::Pop(v);
    }
    dummy.super_SQObject._unVal.pTable = (SQTable *)0x0;
    dummy.super_SQObject._type = OT_NULL;
    dummy.super_SQObject._flags = '\0';
    dummy.super_SQObject._5_3_ = 0;
    et = ET_RESUME_THROW_VM - (throwerror == 0);
    if (v->_debughook == true) {
      bVar2 = SQVM::Execute<true>(v,&dummy,-1,-1,&ret,invoke_err_handler,et);
    }
    else {
      bVar2 = SQVM::Execute<false>(v,&dummy,-1,-1,&ret,invoke_err_handler,et);
    }
    if (bVar2 == false) {
      SVar4 = -1;
    }
    else {
      if (retval != 0) {
        SQVM::Push(v,&ret);
      }
      SVar4 = 0;
    }
    SQObjectPtr::~SQObjectPtr(&dummy);
  }
  SQObjectPtr::~SQObjectPtr(&ret);
  return SVar4;
}

Assistant:

SQRESULT sq_wakeupvm(HSQUIRRELVM v,SQBool wakeupret,SQBool retval,SQBool invoke_err_handler,SQBool throwerror)
{
    SQObjectPtr ret;
    if(!v->_suspended)
        return sq_throwerror(v,_SC("cannot resume a vm that is not running any code"));
    SQInteger target = v->_suspended_target;
    if(wakeupret) {
        if(target != -1) {
            v->GetAt(v->_stackbase+v->_suspended_target)=v->GetUp(-1); //retval
        }
        v->Pop();
    } else if(target != -1) { v->GetAt(v->_stackbase+v->_suspended_target).Null(); }
    SQObjectPtr dummy;

    bool res = v->_debughook ?
        v->Execute<true>(dummy,-1,-1,ret,invoke_err_handler,throwerror?SQVM::ET_RESUME_THROW_VM : SQVM::ET_RESUME_VM) :
        v->Execute<false>(dummy,-1,-1,ret,invoke_err_handler,throwerror?SQVM::ET_RESUME_THROW_VM : SQVM::ET_RESUME_VM);

    if(!res)
        return SQ_ERROR;

    if(retval)
        v->Push(ret);
    return SQ_OK;
}